

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexSubImageCubeBufferCase::createTexture(TexSubImageCubeBufferCase *this)

{
  int iVar1;
  deUint32 internalFormat;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  deInt32 dVar5;
  char *str;
  TransferFormat TVar6;
  reference pvVar7;
  size_type sVar8;
  int local_1c4;
  int local_174;
  int face_1;
  Vector<float,_4> local_144;
  Vector<float,_4> local_134;
  undefined1 local_124 [8];
  Vec4 colorB;
  Vector<float,_4> local_104;
  undefined1 local_f4 [8];
  Vec4 colorA;
  Vec4 cBias;
  Vec4 cScale;
  int height;
  int rowPitch;
  int rowLength;
  undefined1 local_8c [8];
  Vec4 gMax;
  Vec4 gMin;
  int face;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 buf;
  deUint32 tex;
  int pixelSize;
  deUint32 local_30;
  deUint32 dStack_2c;
  TransferFormat transferFmt;
  Random rnd;
  TexSubImageCubeBufferCase *this_local;
  
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)&transferFmt,dVar3);
  TVar6 = glu::getTransferFormat((this->super_TextureCubeSpecCase).m_texFormat);
  iVar4 = tcu::TextureFormat::getPixelSize(&(this->super_TextureCubeSpecCase).m_texFormat);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(gMin.m_data + 3));
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x8513,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  dVar5 = deAlign32((this->super_TextureCubeSpecCase).m_size * iVar4,4);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(gMin.m_data + 3),
             (long)(dVar5 * (this->super_TextureCubeSpecCase).m_size));
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  for (gMin.m_data[2] = 0.0; local_30 = TVar6.format, dStack_2c = TVar6.dataType,
      (int)gMin.m_data[2] < 6; gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
    randomVector<4>((Functional *)(gMax.m_data + 2),(Random *)&transferFmt,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax);
    randomVector<4>((Functional *)local_8c,(Random *)&transferFmt,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin,
                    &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax);
    iVar1 = (this->super_TextureCubeSpecCase).m_size;
    dVar5 = deAlign32(iVar1 * iVar4,4);
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(gMin.m_data + 3),0
                       );
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&rowPitch,&(this->super_TextureCubeSpecCase).m_texFormat,iVar1,
               iVar1,1,dVar5,0,pvVar7);
    tcu::fillWithComponentGradients
              ((PixelBufferAccess *)&rowPitch,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_8c);
    dVar3 = *(deUint32 *)(s_cubeMapFaces + (long)(int)gMin.m_data[2] * 4);
    iVar1 = (this->super_TextureCubeSpecCase).m_size;
    internalFormat = this->m_internalFormat;
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(gMin.m_data + 3),0
                       );
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,dVar3,0
               ,internalFormat,iVar1,iVar1,0,local_30,dStack_2c,pvVar7);
  }
  if (this->m_rowLength < 1) {
    local_1c4 = this->m_subW;
  }
  else {
    local_1c4 = this->m_rowLength;
  }
  dVar5 = deAlign32(local_1c4 * iVar4,this->m_alignment);
  iVar1 = this->m_subH;
  iVar2 = this->m_skipRows;
  tcu::operator-((tcu *)(cBias.m_data + 2),
                 &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax,
                 &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colorA.m_data + 2),
             &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_104,(Vector<float,_4> *)(colorB.m_data + 2),
                 (Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_f4,&local_104,(Vector<float,_4> *)(colorA.m_data + 2));
  tcu::Vector<float,_4>::Vector(&local_144,0.0,1.0,0.0,1.0);
  tcu::operator*((tcu *)&local_134,&local_144,(Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_124,&local_134,(Vector<float,_4> *)(colorA.m_data + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(gMin.m_data + 3),
             (long)(dVar5 * (iVar1 + iVar2) + this->m_offset));
  iVar1 = this->m_subW;
  iVar2 = this->m_subH;
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(gMin.m_data + 3),0);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&stack0xfffffffffffffe90,
             &(this->super_TextureCubeSpecCase).m_texFormat,iVar1,iVar2,1,dVar5,0,
             pvVar7 + (long)this->m_offset +
                      (long)(this->m_skipPixels * iVar4) + (long)(this->m_skipRows * dVar5));
  tcu::fillWithGrid((PixelBufferAccess *)&stack0xfffffffffffffe90,4,(Vec4 *)local_f4,
                    (Vec4 *)local_124);
  sglr::ContextWrapper::glGenBuffers
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glBindBuffer
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x88ec,
             (deUint32)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(gMin.m_data + 3));
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(gMin.m_data + 3),0);
  sglr::ContextWrapper::glBufferData
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x88ec,
             (long)(int)sVar8,pvVar7,0x88e4);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf2,
             this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf3,
             this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf4,
             this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             this->m_alignment);
  for (local_174 = 0; local_174 < 6; local_174 = local_174 + 1) {
    sglr::ContextWrapper::glTexSubImage2D
              (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,
               *(deUint32 *)(s_cubeMapFaces + (long)local_174 * 4),0,this->m_subX,this->m_subY,
               this->m_subW,this->m_subH,local_30,dStack_2c,(void *)(long)this->m_offset);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(gMin.m_data + 3));
  de::Random::~Random((Random *)&transferFmt);
  return;
}

Assistant:

void createTexture (void)
	{
		de::Random				rnd				(deStringHash(getName()));
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		deUint32				tex				= 0;
		deUint32				buf				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

		// Fill faces with different gradients.

		data.resize(deAlign32(m_size*pixelSize, 4)*m_size);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
		{
			const Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			const Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_size, m_size, 1, deAlign32(m_size*pixelSize, 4), 0, &data[0]), gMin, gMax);

			glTexImage2D(s_cubeMapFaces[face], 0, m_internalFormat, m_size, m_size, 0, transferFmt.format, transferFmt.dataType, &data[0]);
		}

		// Fill data with grid.
		{
			int		rowLength	= m_rowLength > 0 ? m_rowLength : m_subW;
			int		rowPitch	= deAlign32(rowLength*pixelSize, m_alignment);
			int		height		= m_subH + m_skipRows;
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			data.resize(rowPitch*height + m_offset);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER,	buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER,	(int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
			glTexSubImage2D(s_cubeMapFaces[face], 0, m_subX, m_subY, m_subW, m_subH, transferFmt.format, transferFmt.dataType, (const void*)(deUintptr)m_offset);
	}